

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O0

TPM_RC TPM_SU_Unmarshal(TPM_SU *target,BYTE **buffer,INT32 *size)

{
  TPM_RC result;
  INT32 *size_local;
  BYTE **buffer_local;
  TPM_SU *target_local;
  
  target_local._4_4_ = UINT16_Unmarshal(target,buffer,size);
  if (target_local._4_4_ == 0) {
    if (*target < 2) {
      target_local._4_4_ = 0;
    }
    else {
      target_local._4_4_ = 0x84;
    }
  }
  return target_local._4_4_;
}

Assistant:

TPM_RC
TPM_SU_Unmarshal(TPM_SU *target, BYTE **buffer, INT32 *size)
{
    TPM_RC    result;
    result = UINT16_Unmarshal((UINT16 *)target, buffer, size);
    if(result != TPM_RC_SUCCESS)
        return result;
    switch(*target) {
        case TPM_SU_CLEAR :
        case TPM_SU_STATE :
            break;
       default :
            return TPM_RC_VALUE;
            break;
    }
    return TPM_RC_SUCCESS;
}